

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtMidi.cpp
# Opt level: O0

void __thiscall MidiInAlsa::initialize(MidiInAlsa *this,string *clientName)

{
  undefined1 *puVar1;
  int iVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  pthread_t pVar5;
  long lVar6;
  size_t __n;
  undefined8 uStack_d0;
  undefined1 auStack_c8 [8];
  undefined1 *local_c0;
  string *local_b8;
  string *local_b0;
  undefined8 local_a8;
  string *local_a0;
  string *local_98;
  MidiApi *local_90;
  undefined1 *local_88;
  snd_seq_queue_tempo_t *qtempo;
  undefined8 *local_60;
  AlsaMidiData *data;
  string local_48;
  int local_24;
  undefined8 uStack_20;
  int result;
  snd_seq_t *seq;
  string *clientName_local;
  MidiInAlsa *this_local;
  
  uStack_d0 = 0x116858;
  local_90 = (MidiApi *)this;
  seq = (snd_seq_t *)clientName;
  clientName_local = (string *)this;
  local_24 = snd_seq_open(&stack0xffffffffffffffe0,"default",3,1);
  if (local_24 < 0) {
    local_a0 = (string *)&local_90->errorString_;
    uStack_d0 = 0x11687f;
    std::__cxx11::string::operator=
              (local_a0,"MidiInAlsa::initialize: error creating ALSA sequencer client object.");
    local_98 = &local_48;
    uStack_d0 = 0x116896;
    std::__cxx11::string::string((string *)local_98,local_a0);
    uStack_d0 = 0x1168ae;
    MidiApi::error(local_90,DRIVER_ERROR,local_98);
    uStack_d0 = 0x1168b9;
    std::__cxx11::string::~string((string *)&local_48);
  }
  else {
    local_a8 = uStack_20;
    uStack_d0 = 0x1168ec;
    uVar4 = std::__cxx11::string::c_str();
    uStack_d0 = 0x1168fb;
    snd_seq_set_client_name(local_a8,uVar4);
    uStack_d0 = 0x116905;
    local_60 = (undefined8 *)operator_new(0x58);
    *local_60 = uStack_20;
    *(undefined4 *)(local_60 + 1) = 0xffffffff;
    *(undefined4 *)((long)local_60 + 0xc) = 0xffffffff;
    local_60[2] = 0;
    uStack_d0 = 0x11693b;
    pVar5 = pthread_self();
    local_60[7] = pVar5;
    local_60[6] = local_60[7];
    *(undefined4 *)((long)local_60 + 0x4c) = 0xffffffff;
    *(undefined4 *)(local_60 + 10) = 0xffffffff;
    local_90->apiData_ = local_60;
    *(undefined8 **)&local_90[1].firstErrorOccurred_ = local_60;
    uStack_d0 = 0x116993;
    iVar2 = pipe((int *)((long)local_60 + 0x4c));
    if (iVar2 == -1) {
      local_b8 = (string *)&local_90->errorString_;
      uStack_d0 = 0x1169b6;
      std::__cxx11::string::operator=
                (local_b8,"MidiInAlsa::initialize: error creating pipe objects.");
      local_b0 = (string *)&qtempo;
      uStack_d0 = 0x1169cd;
      std::__cxx11::string::string((string *)local_b0,local_b8);
      uStack_d0 = 0x1169e5;
      MidiApi::error(local_90,DRIVER_ERROR,local_b0);
      uStack_d0 = 0x1169f0;
      std::__cxx11::string::~string((string *)&qtempo);
    }
    else {
      uStack_d0 = 0x116a1f;
      uVar3 = snd_seq_alloc_named_queue(uStack_20);
      *(undefined4 *)(local_60 + 9) = uVar3;
      uStack_d0 = 0x116a2d;
      lVar6 = snd_seq_queue_tempo_sizeof();
      lVar6 = -(lVar6 + 0xfU & 0xfffffffffffffff0);
      local_c0 = auStack_c8 + lVar6;
      local_88 = local_c0;
      *(undefined8 *)(auStack_c8 + lVar6 + -8) = 0x116a55;
      __n = snd_seq_queue_tempo_sizeof();
      puVar1 = local_c0;
      *(undefined8 *)(auStack_c8 + lVar6 + -8) = 0x116a66;
      memset(puVar1,0,__n);
      puVar1 = local_88;
      *(undefined8 *)(auStack_c8 + lVar6 + -8) = 0x116a74;
      snd_seq_queue_tempo_set_tempo(puVar1,600000);
      puVar1 = local_88;
      *(undefined8 *)(auStack_c8 + lVar6 + -8) = 0x116a82;
      snd_seq_queue_tempo_set_ppq(puVar1,0xf0);
      puVar1 = local_88;
      uVar4 = *local_60;
      uVar3 = *(undefined4 *)(local_60 + 9);
      *(undefined8 *)(auStack_c8 + lVar6 + -8) = 0x116a99;
      snd_seq_set_queue_tempo(uVar4,uVar3,puVar1);
      uVar4 = *local_60;
      *(undefined8 *)(auStack_c8 + lVar6 + -8) = 0x116aa5;
      snd_seq_drain_output(uVar4);
    }
  }
  return;
}

Assistant:

void MidiInAlsa :: initialize( const std::string& clientName )
{
  // Set up the ALSA sequencer client.
  snd_seq_t *seq;
  int result = snd_seq_open( &seq, "default", SND_SEQ_OPEN_DUPLEX, SND_SEQ_NONBLOCK );
  if ( result < 0 ) {
    errorString_ = "MidiInAlsa::initialize: error creating ALSA sequencer client object.";
    error( RtMidiError::DRIVER_ERROR, errorString_ );
    return;
  }

  // Set client name.
  snd_seq_set_client_name( seq, clientName.c_str() );

  // Save our api-specific connection information.
  AlsaMidiData *data = (AlsaMidiData *) new AlsaMidiData;
  data->seq = seq;
  data->portNum = -1;
  data->vport = -1;
  data->subscription = 0;
  data->dummy_thread_id = pthread_self();
  data->thread = data->dummy_thread_id;
  data->trigger_fds[0] = -1;
  data->trigger_fds[1] = -1;
  apiData_ = (void *) data;
  inputData_.apiData = (void *) data;

  if ( pipe(data->trigger_fds) == -1 ) {
    errorString_ = "MidiInAlsa::initialize: error creating pipe objects.";
    error( RtMidiError::DRIVER_ERROR, errorString_ );
    return;
  }

  // Create the input queue
#ifndef AVOID_TIMESTAMPING
  data->queue_id = snd_seq_alloc_named_queue( seq, "RtMidi Queue" );
  // Set arbitrary tempo (mm=100) and resolution (240)
  snd_seq_queue_tempo_t *qtempo;
  snd_seq_queue_tempo_alloca( &qtempo );
  snd_seq_queue_tempo_set_tempo( qtempo, 600000 );
  snd_seq_queue_tempo_set_ppq( qtempo, 240 );
  snd_seq_set_queue_tempo( data->seq, data->queue_id, qtempo );
  snd_seq_drain_output( data->seq );
#endif
}